

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O0

int __thiscall FIWadManager::CheckIWAD(FIWadManager *this,char *doomwaddir,WadStuff *wads)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  FString *pFVar6;
  char *pcVar7;
  FIWADInfo *other;
  bool bVar8;
  FString local_38;
  FString iwad;
  uint i;
  int numfound;
  char *slash;
  WadStuff *wads_local;
  char *doomwaddir_local;
  FIWadManager *this_local;
  
  iwad.Chars._4_4_ = 0;
  bVar8 = false;
  if (*doomwaddir != '\0') {
    sVar5 = strlen(doomwaddir);
    bVar8 = doomwaddir[sVar5 - 1] != '/';
  }
  pcVar1 = "\x01";
  if (bVar8) {
    pcVar1 = "./";
  }
  for (iwad.Chars._0_4_ = 0; uVar2 = (uint)iwad.Chars,
      uVar3 = TArray<FString,_FString>::Size(&this->mIWadNames), uVar2 < uVar3;
      iwad.Chars._0_4_ = (uint)iwad.Chars + 1) {
    pFVar6 = TArray<FString,_FString>::operator[](&this->mIWadNames,(ulong)(uint)iwad.Chars);
    bVar8 = FString::IsNotEmpty(pFVar6);
    if ((bVar8) && (bVar8 = FString::IsEmpty(&wads[(uint)iwad.Chars].Path), bVar8)) {
      FString::FString(&local_38);
      pFVar6 = TArray<FString,_FString>::operator[](&this->mIWadNames,(ulong)(uint)iwad.Chars);
      pcVar7 = FString::GetChars(pFVar6);
      FString::Format(&local_38,"%s%s%s",doomwaddir,pcVar1 + 1,pcVar7);
      FixPathSeperator(&local_38);
      pcVar7 = FString::operator_cast_to_char_(&local_38);
      bVar8 = FileExists(pcVar7);
      if (bVar8) {
        pcVar7 = FString::operator_cast_to_char_(&local_38);
        iVar4 = ScanIWAD(this,pcVar7);
        wads[(uint)iwad.Chars].Type = iVar4;
        if (wads[(uint)iwad.Chars].Type != -1) {
          FString::operator=(&wads[(uint)iwad.Chars].Path,&local_38);
          other = TArray<FIWADInfo,_FIWADInfo>::operator[]
                            (&this->mIWads,(long)wads[(uint)iwad.Chars].Type);
          FString::operator=(&wads[(uint)iwad.Chars].Name,&other->Name);
          iwad.Chars._4_4_ = iwad.Chars._4_4_ + 1;
        }
      }
      FString::~FString(&local_38);
    }
  }
  return iwad.Chars._4_4_;
}

Assistant:

int FIWadManager::CheckIWAD (const char *doomwaddir, WadStuff *wads)
{
	const char *slash;
	int numfound;

	numfound = 0;

	slash = (doomwaddir[0] && doomwaddir[strlen (doomwaddir)-1] != '/') ? "/" : "";

	// Search for a pre-defined IWAD
	for (unsigned i=0; i< mIWadNames.Size(); i++)
	{
		if (mIWadNames[i].IsNotEmpty() && wads[i].Path.IsEmpty())
		{
			FString iwad;
			
			iwad.Format ("%s%s%s", doomwaddir, slash, mIWadNames[i].GetChars());
			FixPathSeperator (iwad);
			if (FileExists (iwad))
			{
				wads[i].Type = ScanIWAD (iwad);
				if (wads[i].Type != -1)
				{
					wads[i].Path = iwad;
					wads[i].Name = mIWads[wads[i].Type].Name;
					numfound++;
				}
			}
		}
	}

	return numfound;
}